

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O0

void __thiscall
SparseArray_HasIndex_Test<pstore::uint128>::TestBody
          (SparseArray_HasIndex_Test<pstore::uint128> *this)

{
  initializer_list<unsigned_long> __l;
  bool bVar1;
  iterator last_index;
  iterator iVar2;
  pointer psVar3;
  char *pcVar4;
  initializer_list<int> values;
  AssertHelper local_2b8;
  Message local_2b0;
  _Self local_2a8;
  key_type local_2a0;
  _Self local_298;
  bool local_28a;
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_7;
  Message local_270;
  _Self local_268;
  key_type local_260;
  _Self local_258;
  bool local_24a;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_6;
  Message local_230;
  _Self local_228;
  key_type local_220;
  _Self local_218;
  bool local_20a;
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_5;
  Message local_1f0;
  _Self local_1e8;
  key_type local_1e0;
  _Self local_1d8;
  bool local_1ca;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_4;
  Message local_1b0;
  _Self local_1a8;
  key_type local_1a0;
  _Self local_198;
  bool local_18a;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_3;
  Message local_170;
  _Self local_168;
  key_type local_160;
  _Self local_158;
  bool local_14a;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_2;
  Message local_130;
  _Self local_128;
  key_type local_120;
  _Self local_118;
  bool local_10a;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  Message local_f0;
  _Self local_e8;
  key_type local_e0;
  _Self local_d8;
  bool local_ca;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
  local_98;
  unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
  arr;
  allocator<unsigned_long> local_7a;
  less<unsigned_long> local_79;
  unsigned_long local_78 [5];
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> indices;
  SparseArray_HasIndex_Test<pstore::uint128> *this_local;
  
  local_78[2] = 5;
  local_78[3] = 7;
  local_78[0] = 2;
  local_78[1] = 3;
  local_50 = local_78;
  local_48 = 4;
  indices._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::allocator<unsigned_long>::allocator(&local_7a);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_40,__l,&local_79,&local_7a);
  std::allocator<unsigned_long>::~allocator(&local_7a);
  last_index = std::
               begin<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                         ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)local_40);
  iVar2 = std::end<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )local_40);
  std::initializer_list<int>::initializer_list((initializer_list<int> *)&gtest_ar.message_);
  values._M_len =
       (size_type)
       gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  values._M_array = (iterator)iVar2._M_node;
  pstore::sparse_array<int,pstore::uint128>::
  make_unique<std::_Rb_tree_const_iterator<unsigned_long>>
            ((_Base_ptr)&local_98,(_Rb_tree_const_iterator<unsigned_long>)last_index._M_node,values)
  ;
  psVar3 = std::
           unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
           ::operator->(&local_98);
  local_c9 = pstore::sparse_array<int,_pstore::uint128>::has_index(psVar3,0);
  local_e0 = 0;
  local_d8._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40,&local_e0);
  local_e8._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40);
  local_ca = std::operator!=(&local_d8,&local_e8);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_c8,"arr->has_index (0)","indices.find (0) != indices.end ()",
             &local_c9,&local_ca);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x10a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  psVar3 = std::
           unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
           ::operator->(&local_98);
  local_109 = pstore::sparse_array<int,_pstore::uint128>::has_index(psVar3,1);
  local_120 = 1;
  local_118._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40,&local_120);
  local_128._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40);
  local_10a = std::operator!=(&local_118,&local_128);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_108,"arr->has_index (1)","indices.find (1) != indices.end ()",
             &local_109,&local_10a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x10b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  psVar3 = std::
           unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
           ::operator->(&local_98);
  local_149 = pstore::sparse_array<int,_pstore::uint128>::has_index(psVar3,2);
  local_160 = 2;
  local_158._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40,&local_160);
  local_168._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40);
  local_14a = std::operator!=(&local_158,&local_168);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_148,"arr->has_index (2)","indices.find (2) != indices.end ()",
             &local_149,&local_14a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x10c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  psVar3 = std::
           unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
           ::operator->(&local_98);
  local_189 = pstore::sparse_array<int,_pstore::uint128>::has_index(psVar3,3);
  local_1a0 = 3;
  local_198._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40,&local_1a0);
  local_1a8._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40);
  local_18a = std::operator!=(&local_198,&local_1a8);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_188,"arr->has_index (3)","indices.find (3) != indices.end ()",
             &local_189,&local_18a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x10d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  psVar3 = std::
           unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
           ::operator->(&local_98);
  local_1c9 = pstore::sparse_array<int,_pstore::uint128>::has_index(psVar3,4);
  local_1e0 = 4;
  local_1d8._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40,&local_1e0);
  local_1e8._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40);
  local_1ca = std::operator!=(&local_1d8,&local_1e8);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_1c8,"arr->has_index (4)","indices.find (4) != indices.end ()",
             &local_1c9,&local_1ca);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x10e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  psVar3 = std::
           unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
           ::operator->(&local_98);
  local_209 = pstore::sparse_array<int,_pstore::uint128>::has_index(psVar3,5);
  local_220 = 5;
  local_218._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40,&local_220);
  local_228._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40);
  local_20a = std::operator!=(&local_218,&local_228);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_208,"arr->has_index (5)","indices.find (5) != indices.end ()",
             &local_209,&local_20a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x10f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  psVar3 = std::
           unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
           ::operator->(&local_98);
  local_249 = pstore::sparse_array<int,_pstore::uint128>::has_index(psVar3,6);
  local_260 = 6;
  local_258._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40,&local_260);
  local_268._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40);
  local_24a = std::operator!=(&local_258,&local_268);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_248,"arr->has_index (6)","indices.find (6) != indices.end ()",
             &local_249,&local_24a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x110,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  psVar3 = std::
           unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
           ::operator->(&local_98);
  local_289 = pstore::sparse_array<int,_pstore::uint128>::has_index(psVar3,7);
  local_2a0 = 7;
  local_298._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40,&local_2a0);
  local_2a8._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  local_40);
  local_28a = std::operator!=(&local_298,&local_2a8);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_288,"arr->has_index (7)","indices.find (7) != indices.end ()",
             &local_289,&local_28a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x111,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  std::
  unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
  ::~unique_ptr(&local_98);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_40);
  return;
}

Assistant:

TYPED_TEST (SparseArray, HasIndex) {
    std::set<std::size_t> indices{2, 3, 5, 7};
    auto arr =
        sparse_array<int, TypeParam>::make_unique (std::begin (indices), std::end (indices), {});
    EXPECT_EQ (arr->has_index (0), indices.find (0) != indices.end ());
    EXPECT_EQ (arr->has_index (1), indices.find (1) != indices.end ());
    EXPECT_EQ (arr->has_index (2), indices.find (2) != indices.end ());
    EXPECT_EQ (arr->has_index (3), indices.find (3) != indices.end ());
    EXPECT_EQ (arr->has_index (4), indices.find (4) != indices.end ());
    EXPECT_EQ (arr->has_index (5), indices.find (5) != indices.end ());
    EXPECT_EQ (arr->has_index (6), indices.find (6) != indices.end ());
    EXPECT_EQ (arr->has_index (7), indices.find (7) != indices.end ());
}